

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O3

_Bool parse_color_value(char **begin,char *end,color_t *color)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  byte *pbVar8;
  plutovg_color_t value;
  plutovg_color_t pStack_38;
  
  pbVar4 = (byte *)*begin;
  if (pbVar4 < end) {
    lVar6 = (long)end - (long)pbVar4;
    pcVar5 = "currentColor" + lVar6;
    lVar7 = 0;
    do {
      pbVar8 = pbVar4 + 0xc;
      if (lVar7 == 0xc) goto LAB_00108d20;
      if (pbVar4[lVar7] != "currentColor"[lVar7]) goto LAB_00108cf1;
      lVar1 = lVar7 + 1;
      lVar7 = lVar7 + 1;
      pbVar8 = (byte *)end;
    } while (pbVar4 + lVar1 != (byte *)end);
  }
  else {
    pcVar5 = "currentColor";
    pbVar8 = pbVar4;
  }
  if (*pcVar5 == '\0') {
LAB_00108d20:
    color->type = color_type_current;
    color->value = 0xff000000;
  }
  else {
    lVar6 = (long)end - (long)pbVar4;
LAB_00108cf1:
    iVar2 = plutovg_color_parse(&pStack_38,(char *)pbVar4,(int)lVar6);
    if (iVar2 == 0) {
      return false;
    }
    color->type = color_type_fixed;
    uVar3 = plutovg_color_to_argb32(&pStack_38);
    color->value = uVar3;
    pbVar8 = pbVar4 + iVar2;
  }
  *begin = (char *)pbVar8;
  pbVar4 = pbVar8;
  if (pbVar8 < end) {
    do {
      pbVar4 = pbVar8;
      if ((0x20 < (ulong)*pbVar8) || ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0)) break;
      pbVar8 = pbVar8 + 1;
      pbVar4 = (byte *)end;
    } while (pbVar8 != (byte *)end);
  }
  *begin = (char *)pbVar4;
  return true;
}

Assistant:

static bool parse_color_value(const char** begin, const char* end, color_t* color)
{
    const char* it = *begin;
    if(skip_string(&it, end, "currentColor")) {
        color->type = color_type_current;
        color->value = 0xFF000000;
    } else {
        plutovg_color_t value;
        int length = plutovg_color_parse(&value, it, end - it);
        if(length == 0)
            return false;
        color->type = color_type_fixed;
        color->value = plutovg_color_to_argb32(&value);
        it += length;
    }

    *begin = it;
    skip_ws(begin, end);
    return true;
}